

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

Time __thiscall helics::FederateState::nextValueTime(FederateState *this)

{
  shared_mutex *__rwlock;
  pointer puVar1;
  Time TVar2;
  long lVar3;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *inp;
  pointer puVar4;
  Time TVar5;
  
  lVar3 = 0x7fffffffffffffff;
  __rwlock = &(this->interfaceInformation).inputs.m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar4 = (this->interfaceInformation).inputs.m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = *(pointer *)
            ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar4 == puVar1) {
    lVar3 = 0x7fffffffffffffff;
  }
  else {
    do {
      TVar2 = InputInfo::nextValueTime
                        ((puVar4->_M_t).
                         super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                         .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl);
      TVar5 = TVar2;
      if (lVar3 <= TVar2.internalTimeCode) {
        TVar5.internalTimeCode = lVar3;
      }
      if (TVar2.internalTimeCode < (this->time_granted).internalTimeCode) {
        TVar5.internalTimeCode = lVar3;
      }
      lVar3 = TVar5.internalTimeCode;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (Time)lVar3;
}

Assistant:

Time FederateState::nextValueTime() const
{
    auto firstValueTime = Time::maxVal();
    for (const auto& inp : interfaceInformation.getInputs()) {
        auto nvt = inp->nextValueTime();
        if (nvt >= time_granted) {
            if (nvt < firstValueTime) {
                firstValueTime = nvt;
            }
        }
    }
    return firstValueTime;
}